

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O0

UINT32 calculateChecksum32(UINT32 *buffer,UINT32 bufferSize)

{
  uint local_24;
  int local_20;
  UINT32 index;
  UINT32 counter;
  UINT32 bufferSize_local;
  UINT32 *buffer_local;
  
  if (buffer == (UINT32 *)0x0) {
    buffer_local._4_4_ = 0;
  }
  else {
    local_20 = 0;
    for (local_24 = 0; local_24 < bufferSize >> 2; local_24 = local_24 + 1) {
      local_20 = local_20 + buffer[local_24];
    }
    buffer_local._4_4_ = -local_20;
  }
  return buffer_local._4_4_;
}

Assistant:

UINT32 calculateChecksum32(const UINT32* buffer, UINT32 bufferSize)
{
    if (!buffer)
        return 0;
    
    UINT32 counter = 0;
    UINT32 index = 0;
    
    bufferSize /= sizeof(UINT32);
    
    for (; index < bufferSize; index++) {
        counter = (UINT32)(counter + buffer[index]);
    }
    
    return (UINT32)(0x100000000ULL - counter);
}